

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O1

long set_state(int table,long sf,long procs,long step,long *extra_rows)

{
  long lVar1;
  undefined4 in_register_0000003c;
  long lVar2;
  long lVar3;
  
  lVar1 = CONCAT44(in_register_0000003c,table);
  if (step == 0 || sf == 0) {
    lVar2 = 0;
  }
  else {
    if (1000 < sf / procs) {
      set_state_cold_1();
      return (lVar1 % 1000) * 100 + (lVar1 / 10) % 0x4e21 + 90000;
    }
    lVar1 = sf * (tdefs[table].base % procs);
    lVar2 = lVar1 / procs + (tdefs[table].base / procs) * sf;
    if (1 < step) {
      lVar3 = step + -1;
      do {
        if (tdefs[table].gen_seed != (_func_long_varargs *)0x0) {
          (*tdefs[table].gen_seed)((ulong)(table == 5),lVar2);
          if ((long)tdefs[table].child != -1) {
            (*tdefs[tdefs[table].child].gen_seed)(0,lVar2);
          }
        }
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    *extra_rows = lVar1 % procs;
    if ((procs < step) && (tdefs[table].gen_seed != (_func_long_varargs *)0x0)) {
      (*tdefs[table].gen_seed)();
    }
  }
  return lVar2;
}

Assistant:

long
set_state(int table, long sf, long procs, long step, long *extra_rows)
{
    int i;
	long rowcount, remainder, result;
	
    if (sf == 0 || step == 0)
        {
        return(0);
        }

	rowcount = tdefs[table].base / procs;
	if ((sf / procs) > (int)MAX_32B_SCALE)
		INTERNAL_ERROR("SCALE OVERFLOW. RE-RUN WITH MORE CHILDREN.");
	rowcount *= sf;
	remainder = (tdefs[table].base % procs) * sf;
	rowcount += remainder / procs;
	result = rowcount;
	for (i=0; i < step - 1; i++)
		{
		if (tdefs[table].gen_seed == NULL)
			{
			/* must be a deterministic table, which doesn't need a random seed. */
			continue;
			}
		if (table == LINE)	/* special case for shared seeds */
			tdefs[table].gen_seed(1, rowcount);
		else if (tdefs[table].gen_seed != NULL)
			tdefs[table].gen_seed(0, rowcount);
		/* need to set seeds of child in case there's a dependency */
		/* NOTE: this assumes that the parent and child have the same base row count */
			if (tdefs[table].child != NONE) 
			tdefs[tdefs[table].child].gen_seed(0,rowcount);
		}
	*extra_rows = remainder % procs;
	if (step > procs)	/* moving to the end to generate updates */
		{
		if (tdefs[table].gen_seed != NULL)
			{
			tdefs[table].gen_seed(*extra_rows);
			}
		}

	return(result);
}